

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  undefined1 *puVar1;
  char *pcVar2;
  CURLUcode CVar3;
  int iVar4;
  CURLU *u;
  ulong uVar5;
  size_t sVar6;
  CURLcode CVar7;
  proxy_info *ppVar8;
  curl_proxytype cVar9;
  char *scheme;
  char *proxypasswd;
  char *proxyuser;
  char *host;
  char *portptr;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  curl_proxytype local_44;
  char *local_40;
  proxy_info *local_38;
  
  local_40 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  u = curl_url();
  local_68 = (char *)0x0;
  CVar3 = curl_url_set(u,CURLUPART_URL,proxy,0x208);
  if (CVar3 != CURLUE_OK) {
    Curl_failf(data,"Unsupported proxy syntax in \'%s\'",proxy);
    CVar7 = CURLE_COULDNT_RESOLVE_PROXY;
    goto LAB_0014cfd1;
  }
  CVar3 = curl_url_get(u,CURLUPART_SCHEME,&local_68,0);
  if (CVar3 == CURLUE_OK) {
    iVar4 = Curl_strcasecompare("https",local_68);
    cVar9 = CURLPROXY_HTTPS;
    if (iVar4 == 0) {
      iVar4 = Curl_strcasecompare("socks5h",local_68);
      cVar9 = CURLPROXY_SOCKS5_HOSTNAME;
      if (iVar4 == 0) {
        iVar4 = Curl_strcasecompare("socks5",local_68);
        cVar9 = CURLPROXY_SOCKS5;
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare("socks4a",local_68);
          cVar9 = CURLPROXY_SOCKS4A;
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare("socks4",local_68);
            cVar9 = CURLPROXY_SOCKS4;
            if (((iVar4 == 0) && (iVar4 = Curl_strcasecompare("socks",local_68), iVar4 == 0)) &&
               (iVar4 = Curl_strcasecompare("http",local_68), cVar9 = proxytype, iVar4 == 0)) {
              Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
              CVar7 = CURLE_COULDNT_CONNECT;
              goto LAB_0014cfd1;
            }
          }
        }
      }
    }
    if ((cVar9 == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
      Curl_failf(data,"Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
                 proxy);
      CVar7 = CURLE_NOT_BUILT_IN;
      goto LAB_0014cfd1;
    }
    local_44 = cVar9 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
    local_38 = &conn->socks_proxy;
    ppVar8 = &conn->http_proxy;
    if (local_44 == CURLPROXY_SOCKS4) {
      ppVar8 = local_38;
    }
    ppVar8->proxytype = cVar9;
    CVar3 = curl_url_get(u,CURLUPART_USER,&local_58,0x40);
    CVar7 = CURLE_OK;
    if (((CVar3 != CURLUE_NO_USER) && (CVar3 != CURLUE_OK)) ||
       ((CVar3 = curl_url_get(u,CURLUPART_PASSWORD,&local_60,0x40), CVar3 != CURLUE_NO_PASSWORD &&
        (CVar3 != CURLUE_OK)))) goto LAB_0014cfd1;
    if (local_60 != (char *)0x0 || local_58 != (char *)0x0) {
      (*Curl_cfree)(ppVar8->user);
      ppVar8->user = (char *)0x0;
      ppVar8->user = local_58;
      CVar7 = Curl_setstropt(&(data->state).aptr.proxyuser,local_58);
      local_58 = (char *)0x0;
      if (CVar7 != CURLE_OK) goto LAB_0014cfd1;
      (*Curl_cfree)(ppVar8->passwd);
      ppVar8->passwd = (char *)0x0;
      if ((local_60 == (char *)0x0) && (local_60 = (*Curl_cstrdup)(""), local_60 == (char *)0x0))
      goto LAB_0014ccb2;
      ppVar8->passwd = local_60;
      CVar7 = Curl_setstropt(&(data->state).aptr.proxypasswd,local_60);
      local_60 = (char *)0x0;
      if (CVar7 != CURLE_OK) goto LAB_0014cfd1;
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 | 4;
    }
    curl_url_get(u,CURLUPART_PORT,&local_40,0);
    if (local_40 == (char *)0x0) {
      uVar5 = (data->set).proxyport;
      if ((uVar5 == 0) && (uVar5 = 0x438, cVar9 == CURLPROXY_HTTPS)) {
        uVar5 = 0x1bb;
      }
    }
    else {
      uVar5 = strtol(local_40,(char **)0x0,10);
      (*Curl_cfree)(local_40);
    }
    if ((-1 < (int)uVar5) &&
       (((ppVar8->port = uVar5 & 0xffffffff, local_44 == CURLPROXY_SOCKS4 || (conn->port < 0)) ||
        ((local_38->host).rawalloc == (char *)0x0)))) {
      conn->port = (int)uVar5;
    }
    CVar3 = curl_url_get(u,CURLUPART_HOST,&local_50,0x40);
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (CVar3 == CURLUE_OK) {
      (*Curl_cfree)((ppVar8->host).rawalloc);
      pcVar2 = local_50;
      (ppVar8->host).rawalloc = (char *)0x0;
      (ppVar8->host).rawalloc = local_50;
      if (*local_50 == '[') {
        sVar6 = strlen(local_50);
        pcVar2[sVar6 - 1] = '\0';
        local_50 = local_50 + 1;
        zonefrom_url(u,data,conn);
      }
      (ppVar8->host).name = local_50;
      CVar7 = CURLE_OK;
    }
  }
  else {
LAB_0014ccb2:
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
LAB_0014cfd1:
  (*Curl_cfree)(local_58);
  (*Curl_cfree)(local_60);
  (*Curl_cfree)(local_68);
  curl_url_cleanup(u);
  return CVar7;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr = NULL;
  int port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  uc = curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_USER))
    goto error;
  uc = curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_PASSWORD))
    goto error;

  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    result = Curl_setstropt(&data->state.aptr.proxyuser, proxyuser);
    proxyuser = NULL;
    if(result)
      goto error;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    result = Curl_setstropt(&data->state.aptr.proxypasswd, proxypasswd);
    proxypasswd = NULL;
    if(result)
      goto error;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  (void)curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = (int)strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = (int)data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
    zonefrom_url(uhp, data, conn);
  }
  proxyinfo->host.name = host;

  error:
  free(proxyuser);
  free(proxypasswd);
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}